

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITType.cpp
# Opt level: O2

void JITType::BuildFromJsType(Type *jsType,JITType *jitType)

{
  DynamicTypeHandler *this;
  bool bVar1;
  TypePropertyCache *ptr;
  
  (jitType->m_data).exists = '\x01';
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(jitType->m_data).addr,jsType);
  (jitType->m_data).typeId = jsType->typeId;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            (&(jitType->m_data).libAddr,(jsType->javascriptLibrary).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            (&(jitType->m_data).protoAddr,(jsType->prototype).ptr);
  (jitType->m_data).entrypointAddr = (Type)jsType->entryPoint;
  ptr = Js::Type::GetPropertyCache(jsType);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(jitType->m_data).propertyCacheAddr,ptr);
  bVar1 = Js::DynamicType::Is(jsType);
  if (bVar1) {
    (jitType->m_data).isShared = *(Type *)((long)&jsType[1].javascriptLibrary.ptr + 1);
    this = *(DynamicTypeHandler **)(jsType + 1);
    bVar1 = Js::DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(this);
    (jitType->m_data).handler.isObjectHeaderInlinedTypeHandler = bVar1;
    (jitType->m_data).handler.flags = this->flags;
    (jitType->m_data).handler.inlineSlotCapacity = this->inlineSlotCapacity;
    (jitType->m_data).handler.offsetOfInlineSlots = this->offsetOfInlineSlots;
    (jitType->m_data).handler.slotCapacity = this->slotCapacity;
  }
  return;
}

Assistant:

void
JITType::BuildFromJsType(__in Js::Type * jsType, __out JITType * jitType)
{
    TypeIDL * data = jitType->GetData();
    data->exists = true;
    data->addr = jsType;
    data->typeId = jsType->GetTypeId();
    data->libAddr = jsType->GetLibrary();
    data->protoAddr = jsType->GetPrototype();
    data->entrypointAddr = (intptr_t)jsType->GetEntryPoint();
    data->propertyCacheAddr = jsType->GetPropertyCache();
    if (Js::DynamicType::Is(jsType))
    {
        Js::DynamicType * dynamicType = static_cast<Js::DynamicType*>(jsType);

        data->isShared = dynamicType->GetIsShared();

        Js::DynamicTypeHandler * handler = dynamicType->GetTypeHandler();
        data->handler.isObjectHeaderInlinedTypeHandler = handler->IsObjectHeaderInlinedTypeHandler();
        data->handler.flags = handler->GetFlags();
        data->handler.inlineSlotCapacity = handler->GetInlineSlotCapacity();
        data->handler.offsetOfInlineSlots = handler->GetOffsetOfInlineSlots();
        data->handler.slotCapacity = handler->GetSlotCapacity();
    }
}